

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void pragmaFunclistLine(Vdbe *v,FuncDef *p,int isBuiltin,int showInternFuncs)

{
  int in_ECX;
  uint in_EDX;
  short *in_RSI;
  Vdbe *in_RDI;
  char *zType;
  u32 mask;
  char *local_28;
  uint local_1c;
  short *local_10;
  
  local_1c = 0x3c0800;
  local_10 = in_RSI;
  if (in_ECX != 0) {
    local_1c = 0xffffffff;
  }
  for (; local_10 != (short *)0x0; local_10 = *(short **)(local_10 + 8)) {
    if ((*(long *)(local_10 + 0xc) != 0) &&
       (((*(uint *)(local_10 + 2) & 0x40000) == 0 || (in_ECX != 0)))) {
      if (*(long *)(local_10 + 0x14) == 0) {
        if (*(long *)(local_10 + 0x10) == 0) {
          local_28 = "s";
        }
        else {
          local_28 = "a";
        }
      }
      else {
        local_28 = "w";
      }
      sqlite3VdbeMultiLoad
                (in_RDI,1,"sissii",*(undefined8 *)(local_10 + 0x1c),(ulong)in_EDX,local_28,
                 pragmaFunclistLine::azEnc[*(uint *)(local_10 + 2) & 3],(int)*local_10,
                 *(uint *)(local_10 + 2) & local_1c ^ 0x200000);
    }
  }
  return;
}

Assistant:

static void pragmaFunclistLine(
  Vdbe *v,               /* The prepared statement being created */
  FuncDef *p,            /* A particular function definition */
  int isBuiltin,         /* True if this is a built-in function */
  int showInternFuncs    /* True if showing internal functions */
){
  u32 mask =
      SQLITE_DETERMINISTIC |
      SQLITE_DIRECTONLY |
      SQLITE_SUBTYPE |
      SQLITE_INNOCUOUS |
      SQLITE_FUNC_INTERNAL
  ;
  if( showInternFuncs ) mask = 0xffffffff;
  for(; p; p=p->pNext){
    const char *zType;
    static const char *azEnc[] = { 0, "utf8", "utf16le", "utf16be" };

    assert( SQLITE_FUNC_ENCMASK==0x3 );
    assert( strcmp(azEnc[SQLITE_UTF8],"utf8")==0 );
    assert( strcmp(azEnc[SQLITE_UTF16LE],"utf16le")==0 );
    assert( strcmp(azEnc[SQLITE_UTF16BE],"utf16be")==0 );

    if( p->xSFunc==0 ) continue;
    if( (p->funcFlags & SQLITE_FUNC_INTERNAL)!=0
     && showInternFuncs==0
    ){
      continue;
    }
    if( p->xValue!=0 ){
      zType = "w";
    }else if( p->xFinalize!=0 ){
      zType = "a";
    }else{
      zType = "s";
    }
    sqlite3VdbeMultiLoad(v, 1, "sissii",
       p->zName, isBuiltin,
       zType, azEnc[p->funcFlags&SQLITE_FUNC_ENCMASK],
       p->nArg,
       (p->funcFlags & mask) ^ SQLITE_INNOCUOUS
    );
  }
}